

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sids.cpp
# Opt level: O0

void __thiscall E64::sids_ic::write_byte(sids_ic *this,uint8_t address,uint8_t byte)

{
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  
  if ((in_SIL & 0x80) == 0) {
    SID::write((SID *)(in_RDI + (long)((int)(in_SIL & 0x20) >> 5) * 17000),
               (uint)*(byte *)(in_RDI + 0x884e0 + (long)(int)(in_SIL & 0x1f)),(void *)(ulong)in_DL,
               (long)(int)(in_SIL & 0x1f));
  }
  else {
    *(byte *)(in_RDI + 34000 + (long)(int)(in_SIL & 7)) = in_DL;
  }
  return;
}

Assistant:

void E64::sids_ic::write_byte(uint8_t address, uint8_t byte)
{
    // each sid requires 32 addresses (of which 29 are used)
    // bit 7 of address determines if a sid chip should be addressed
    // bits 5 determines which sid chip of the two
    // bits 0 to 4 are the actual address within one sid chip
    if(address & 0x80)
    {
        balance_registers[address & 0x07] = byte;
    }
    else
    {
        // nb change 0x20 into 0x60 if four SID chips are being used
        sid[ (address & 0x20) >> 5 ].write( register_index[address & 0x1f], byte); // NEEDS CHECKING!!!
    }
}